

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O1

void __thiscall chrono::ChArchiveExplorer::ClearSearch(ChArchiveExplorer *this)

{
  pointer ppCVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->found = false;
  this->find_all = false;
  this->found_obj = false;
  this->tablevel = 0;
  ppCVar1 = (this->results).
            super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->results).super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar1) {
    (this->results).super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->search_tokens,
                    (this->search_tokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->search_tokens,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->in_array).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
  ppCVar1 = (this->results).
            super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->results).super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar1) {
    uVar2 = 0;
    do {
      if (ppCVar1[uVar2] != (ChValue *)0x0) {
        (*ppCVar1[uVar2]->_vptr_ChValue[1])();
      }
      uVar2 = uVar2 + 1;
      ppCVar1 = (this->results).
                super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->results).
                                   super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void ClearSearch() {
        this->found = false;
        this->find_all = false;
        this->found_obj = false;
        this->tablevel = 0;
        this->results.clear();
        this->search_tokens.clear();
        this->search_tokens.push_back(""); // for root lavel
        this->in_array.clear();
        this->in_array.push_back(false); // for root level
        for (int i=0; i<this->results.size(); ++i) {
            delete (this->results[i]);
        }
      }